

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# writer.h
# Opt level: O1

bool __thiscall
rapidjson::
Writer<rapidjson::GenericStringBuffer<rapidjson::UTF8<char>,_rapidjson::CrtAllocator>,_rapidjson::UTF8<char>,_rapidjson::UTF8<char>,_rapidjson::CrtAllocator,_0U>
::EndObject(Writer<rapidjson::GenericStringBuffer<rapidjson::UTF8<char>,_rapidjson::CrtAllocator>,_rapidjson::UTF8<char>,_rapidjson::UTF8<char>,_rapidjson::CrtAllocator,_0U>
            *this,SizeType memberCount)

{
  char *pcVar1;
  
  pcVar1 = (this->level_stack_).stackTop_;
  if ((ulong)((long)pcVar1 - (long)(this->level_stack_).stack_) < 0x10) {
    __assert_fail("level_stack_.GetSize() >= sizeof(Level)",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/arnodeceuninck[P]CLizard/src/indiv/rapidjson/writer.h"
                  ,0xe8,
                  "bool rapidjson::Writer<rapidjson::GenericStringBuffer<rapidjson::UTF8<>>>::EndObject(SizeType) [OutputStream = rapidjson::GenericStringBuffer<rapidjson::UTF8<>>, SourceEncoding = rapidjson::UTF8<>, TargetEncoding = rapidjson::UTF8<>, StackAllocator = rapidjson::CrtAllocator, writeFlags = 0]"
                 );
  }
  if (pcVar1[-8] != '\x01') {
    if ((pcVar1[-0x10] & 1U) == 0) {
      (this->level_stack_).stackTop_ = pcVar1 + -0x10;
      pcVar1 = internal::Stack<rapidjson::CrtAllocator>::Push<char>(&this->os_->stack_,1);
      *pcVar1 = '}';
      return true;
    }
    __assert_fail("0 == level_stack_.template Top<Level>()->valueCount % 2",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/arnodeceuninck[P]CLizard/src/indiv/rapidjson/writer.h"
                  ,0xea,
                  "bool rapidjson::Writer<rapidjson::GenericStringBuffer<rapidjson::UTF8<>>>::EndObject(SizeType) [OutputStream = rapidjson::GenericStringBuffer<rapidjson::UTF8<>>, SourceEncoding = rapidjson::UTF8<>, TargetEncoding = rapidjson::UTF8<>, StackAllocator = rapidjson::CrtAllocator, writeFlags = 0]"
                 );
  }
  __assert_fail("!level_stack_.template Top<Level>()->inArray",
                "/workspace/llm4binary/github/license_all_cmakelists_25/arnodeceuninck[P]CLizard/src/indiv/rapidjson/writer.h"
                ,0xe9,
                "bool rapidjson::Writer<rapidjson::GenericStringBuffer<rapidjson::UTF8<>>>::EndObject(SizeType) [OutputStream = rapidjson::GenericStringBuffer<rapidjson::UTF8<>>, SourceEncoding = rapidjson::UTF8<>, TargetEncoding = rapidjson::UTF8<>, StackAllocator = rapidjson::CrtAllocator, writeFlags = 0]"
               );
}

Assistant:

bool EndObject(SizeType memberCount = 0) {
        (void)memberCount;
        RAPIDJSON_ASSERT(level_stack_.GetSize() >= sizeof(Level)); // not inside an Object
        RAPIDJSON_ASSERT(!level_stack_.template Top<Level>()->inArray); // currently inside an Array, not Object
        RAPIDJSON_ASSERT(0 == level_stack_.template Top<Level>()->valueCount % 2); // Object has a Key without a Value
        level_stack_.template Pop<Level>(1);
        return EndValue(WriteEndObject());
    }